

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlib_embedded.h
# Opt level: O2

void __thiscall trun::DynLibEmbedded::~DynLibEmbedded(DynLibEmbedded *this)

{
  ~DynLibEmbedded(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

virtual ~DynLibEmbedded() = default;